

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAssociation.cpp
# Opt level: O1

bool __thiscall DIS::EntityAssociation::operator==(EntityAssociation *this,EntityAssociation *rhs)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  bool bVar9;
  
  uVar1 = rhs->_recordType;
  uVar2 = this->_recordType;
  uVar3 = rhs->_changeIndicator;
  uVar4 = this->_changeIndicator;
  uVar5 = rhs->_associationStatus;
  uVar6 = this->_associationStatus;
  uVar7 = rhs->_associationType;
  uVar8 = this->_associationType;
  bVar9 = EntityID::operator==(&this->_entityID,&rhs->_entityID);
  return ((((bVar9 && this->_owsSttionLocation == rhs->_owsSttionLocation) &&
           this->_physicalConnectionType == rhs->_physicalConnectionType) &&
          (this->_groupNumber == rhs->_groupNumber &&
          this->_groupMemberType == rhs->_groupMemberType)) &&
         ((uVar8 == uVar7 && uVar6 == uVar5) && uVar4 == uVar3)) && uVar2 == uVar1;
}

Assistant:

bool EntityAssociation::operator ==(const EntityAssociation& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_changeIndicator == rhs._changeIndicator) ) ivarsEqual = false;
     if( ! (_associationStatus == rhs._associationStatus) ) ivarsEqual = false;
     if( ! (_associationType == rhs._associationType) ) ivarsEqual = false;
     if( ! (_entityID == rhs._entityID) ) ivarsEqual = false;
     if( ! (_owsSttionLocation == rhs._owsSttionLocation) ) ivarsEqual = false;
     if( ! (_physicalConnectionType == rhs._physicalConnectionType) ) ivarsEqual = false;
     if( ! (_groupMemberType == rhs._groupMemberType) ) ivarsEqual = false;
     if( ! (_groupNumber == rhs._groupNumber) ) ivarsEqual = false;

    return ivarsEqual;
 }